

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_table.c
# Opt level: O1

char * getElementValue(IXML_Node *node)

{
  short sVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  lVar2 = ixmlNode_getFirstChild();
  if (lVar2 != 0) {
    sVar1 = ixmlNode_getNodeType(lVar2);
    if (sVar1 == 3) {
      uVar3 = ixmlNode_getNodeValue(lVar2);
      pcVar4 = (char *)ixmlCloneDOMString(uVar3);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

DOMString getElementValue(IXML_Node *node)
{
	IXML_Node *child = (IXML_Node *)ixmlNode_getFirstChild(node);
	const DOMString temp = NULL;

	if (child && ixmlNode_getNodeType(child) == eTEXT_NODE) {
		temp = ixmlNode_getNodeValue(child);

		return ixmlCloneDOMString(temp);
	} else {
		return NULL;
	}
}